

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint.h
# Opt level: O0

SafeInt<int> mp::operator-(SafeInt<int> a,SafeInt<int> b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__s;
  OverflowError *this;
  SafeInt<int> in_ESI;
  SafeInt<int> in_EDI;
  int b_value;
  int a_value;
  OverflowError *in_stack_ffffffffffffffc0;
  SafeInt<int> local_4;
  
  iVar1 = val(in_EDI);
  iVar2 = val(in_ESI);
  if (iVar1 < 0) {
    iVar3 = std::numeric_limits<int>::min();
    if (iVar1 - iVar3 < iVar2) {
      this = (OverflowError *)__cxa_allocate_exception(8);
      memset(this,0,8);
      OverflowError::OverflowError(this);
      __cxa_throw(this,&OverflowError::typeinfo,OverflowError::~OverflowError);
    }
  }
  else {
    iVar3 = std::numeric_limits<int>::max();
    if (iVar2 < iVar1 - iVar3) {
      __s = (void *)__cxa_allocate_exception(8);
      memset(__s,0,8);
      OverflowError::OverflowError(in_stack_ffffffffffffffc0);
      __cxa_throw(__s,&OverflowError::typeinfo,OverflowError::~OverflowError);
    }
  }
  SafeInt<int>::SafeInt(&local_4,iVar1 - iVar2);
  return (SafeInt<int>)local_4.value_;
}

Assistant:

inline SafeInt<T> operator-(SafeInt<T> a, SafeInt<T> b) {
  T a_value = val(a), b_value = val(b);
  if (a_value >= 0) {
    if (b_value < a_value - std::numeric_limits<T>::max())
      throw OverflowError();
  } else if (b_value > a_value - std::numeric_limits<T>::min())
    throw OverflowError();
  return a_value - b_value;
}